

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

void __thiscall
phmap::priv::
parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::priv::(anonymous_namespace)::Hash,_phmap::priv::(anonymous_namespace)::Eq,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
::Inner::Inner(Inner *this,Params *p)

{
  hasher *phVar1;
  long lVar2;
  ulong uVar3;
  
  uVar3 = p->bucket_cnt;
  phVar1 = p->hashfn;
  (this->set_).ctrl_ =
       EmptyGroup<std::is_same<std::allocator<std::pair<unsigned_long_const,unsigned_long>>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>()
       ::empty_group;
  (this->set_).slots_ = (slot_type *)0x0;
  (this->set_).size_ = 0;
  (this->set_).capacity_ = 0;
  (this->set_).settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::(anonymous_namespace)::Hash,_phmap::priv::(anonymous_namespace)::Eq,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::Hash,_phmap::priv::(anonymous_namespace)::Eq,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  .super__Head_base<1UL,_phmap::priv::(anonymous_namespace)::Hash,_false>._M_head_impl.tracker =
       phVar1->tracker;
  (this->set_).settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::(anonymous_namespace)::Hash,_phmap::priv::(anonymous_namespace)::Eq,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = 0;
  if (uVar3 != 0) {
    lVar2 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    uVar3 = 0xffffffffffffffff >> (~(byte)lVar2 & 0x3f);
    raw_hash_set<phmap::priv::NodeHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::priv::(anonymous_namespace)::Hash,_phmap::priv::(anonymous_namespace)::Eq,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
    ::reset_growth_left(&this->set_,uVar3);
    raw_hash_set<phmap::priv::NodeHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::priv::(anonymous_namespace)::Hash,_phmap::priv::(anonymous_namespace)::Eq,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
    ::initialize_slots(&this->set_,uVar3);
    (this->set_).capacity_ = uVar3;
  }
  return;
}

Assistant:

Inner(Params const &p) : set_(p.bucket_cnt, p.hashfn, p.eq, p.alloc)
        {}